

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_binary_op.cxx
# Opt level: O0

void __thiscall HAXX_BINARY_OP::real_binary_add::test_method(real_binary_add *this)

{
  undefined8 uVar1;
  bool bVar2;
  double x;
  quaternion<double> r;
  quaternion<double> p;
  quaternion<double> q;
  char *in_stack_fffffffffffff698;
  quaternion<double> *in_stack_fffffffffffff6a0;
  char *in_stack_fffffffffffff6a8;
  undefined1 local_658 [32];
  undefined1 local_638 [40];
  undefined1 local_610 [16];
  basic_cstring<const_char> local_600;
  double local_5f0;
  undefined1 local_5e8 [32];
  undefined1 local_5c8 [40];
  undefined1 local_5a0 [16];
  basic_cstring<const_char> local_590;
  double local_580;
  undefined1 local_578 [32];
  undefined1 local_558 [40];
  undefined1 local_530 [16];
  basic_cstring<const_char> local_520;
  double local_510;
  undefined1 local_508 [32];
  undefined1 local_4e8 [40];
  undefined1 local_4c0 [16];
  basic_cstring<const_char> local_4b0;
  double local_4a0;
  undefined1 local_498 [32];
  undefined1 local_478 [40];
  undefined1 local_450 [16];
  basic_cstring<const_char> local_440;
  double local_430;
  undefined1 local_428 [32];
  undefined1 local_408 [40];
  undefined1 local_3e0 [16];
  basic_cstring<const_char> local_3d0;
  double local_3c0;
  undefined1 local_3b8 [32];
  undefined1 local_398 [40];
  undefined1 local_370 [16];
  basic_cstring<const_char> local_360;
  double local_350;
  undefined1 local_348 [32];
  undefined1 local_328 [40];
  undefined1 local_300 [16];
  basic_cstring<const_char> local_2f0;
  double local_2e0;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [40];
  undefined1 local_290 [16];
  basic_cstring<const_char> local_280;
  double local_270;
  undefined1 local_268 [32];
  undefined1 local_248 [40];
  undefined1 local_220 [16];
  basic_cstring<const_char> local_210;
  double local_200;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [16];
  basic_cstring<const_char> local_1a0;
  double local_190;
  quaternion<double> local_188;
  basic_cstring<const_char> local_168;
  undefined1 local_158 [40];
  undefined1 local_130 [16];
  basic_cstring<const_char> local_120;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  quaternion<double> local_a8;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  quaternion<double> local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = 0.0;
  local_88 = 0.0;
  HAXX::quaternion<double>::quaternion(&local_68,&local_70,&local_78,&local_80,&local_88);
  local_b0 = 0.0;
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  HAXX::quaternion<double>::quaternion(&local_a8,&local_b0,&local_b8,&local_c0,&local_c8);
  local_d0 = -4.59;
  HAXX::operator+(in_stack_fffffffffffff6a0,(double *)in_stack_fffffffffffff698);
  local_68._M_real = local_f0;
  local_68._M_imag_i = local_e8;
  local_68._M_imag_j = local_e0;
  local_68._M_imag_k = local_d8;
  HAXX::operator+(&in_stack_fffffffffffff6a0->_M_real,
                  (quaternion<double> *)in_stack_fffffffffffff698);
  local_a8._M_real = local_110;
  local_a8._M_imag_i = local_108;
  local_a8._M_imag_j = local_100;
  local_a8._M_imag_k = local_f8;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_120,0x17,local_130);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_188._M_imag_i = HAXX::quaternion<double>::real(&local_68);
    local_188._M_real = HAXX::quaternion<double>::real(&local_28);
    local_188._M_real = local_188._M_real + local_d0;
    local_190 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.real() + x";
    in_stack_fffffffffffff6a0 = &local_188;
    in_stack_fffffffffffff698 = "p.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_158,&local_168,0x17,1,8,&local_188._M_imag_i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x190a91);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a0,0x18,local_1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1f8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_1f8._8_8_ = HAXX::quaternion<double>::imag_i(&local_68);
    local_1f8._0_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_200 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.imag_i()";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_1f8;
    in_stack_fffffffffffff698 = "p.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_1d8,local_1f8 + 0x10,0x18,1,8,local_1f8 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x190c47);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_210,0x19,local_220);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_268 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_268._8_8_ = HAXX::quaternion<double>::imag_j(&local_68);
    local_268._0_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_270 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.imag_j()";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_268;
    in_stack_fffffffffffff698 = "p.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_248,local_268 + 0x10,0x19,1,8,local_268 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x190dfd);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_280,0x1a,local_290);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2d8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_2d8._8_8_ = HAXX::quaternion<double>::imag_k(&local_68);
    local_2d8._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_2e0 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.imag_k()";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_2d8;
    in_stack_fffffffffffff698 = "p.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_2b8,local_2d8 + 0x10,0x1a,1,8,local_2d8 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x190fb3);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2f0,0x1c,local_300);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_348 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_348._8_8_ = HAXX::quaternion<double>::real(&local_a8);
    local_348._0_8_ = HAXX::quaternion<double>::real(&local_28);
    local_348._0_8_ = (double)local_348._0_8_ + local_d0;
    local_350 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.real() + x";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_348;
    in_stack_fffffffffffff698 = "r.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_328,local_348 + 0x10,0x1c,1,8,local_348 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x191176);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_360,0x1d,local_370);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3b8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_3b8._8_8_ = HAXX::quaternion<double>::imag_i(&local_a8);
    local_3b8._0_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_3c0 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.imag_i()";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_3b8;
    in_stack_fffffffffffff698 = "r.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_398,local_3b8 + 0x10,0x1d,1,8,local_3b8 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19132c);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3d0,0x1e,local_3e0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_428 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_428._8_8_ = HAXX::quaternion<double>::imag_j(&local_a8);
    local_428._0_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_430 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.imag_j()";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_428;
    in_stack_fffffffffffff698 = "r.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_408,local_428 + 0x10,0x1e,1,8,local_428 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1914e2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x1f,local_450);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_498 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_498._8_8_ = HAXX::quaternion<double>::imag_k(&local_a8);
    local_498._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_4a0 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "q.imag_k()";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_498;
    in_stack_fffffffffffff698 = "r.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_478,local_498 + 0x10,0x1f,1,8,local_498 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x191698);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b0,0x21,local_4c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_508 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_508._8_8_ = HAXX::quaternion<double>::real(&local_28);
    local_508._0_8_ = 1.0;
    local_510 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "1.";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_508;
    in_stack_fffffffffffff698 = "q.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_4e8,local_508 + 0x10,0x21,1,8,local_508 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x191836);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_520,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_520,0x22,local_530);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_578 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_578._8_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_578._0_8_ = 2.0;
    local_580 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "2.";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_578;
    in_stack_fffffffffffff698 = "q.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_558,local_578 + 0x10,0x22,1,8,local_578 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1919d4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_590,0x23,local_5a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_5e8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_5e8._8_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_5e8._0_8_ = 3.0;
    local_5f0 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "3.";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_5e8;
    in_stack_fffffffffffff698 = "q.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_5c8,local_5e8 + 0x10,0x23,1,8,local_5e8 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x191b5a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_600,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_600,0x24,local_610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6a8,(char (*) [1])in_stack_fffffffffffff6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_658 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_658._8_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_658._0_8_ = 4.0;
    boost::math::fpc::percent_tolerance<double>((double)in_stack_fffffffffffff698);
    in_stack_fffffffffffff6a8 = "4.";
    in_stack_fffffffffffff6a0 = (quaternion<double> *)local_658;
    in_stack_fffffffffffff698 = "q.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_638,local_658 + 0x10,0x24,1,8,local_658 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x191cce);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(real_binary_add)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.),p,r;
  double x = -4.59;
  p = q + x;
  r = x + q;

  BOOST_CHECK_CLOSE(p.real(),  q.real() + x, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_i(),q.imag_i()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_j(),q.imag_j()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_k(),q.imag_k()  , COMPARE_TOL);

  BOOST_CHECK_CLOSE(r.real(),  q.real() + x, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_i(),q.imag_i()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_j(),q.imag_j()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_k(),q.imag_k()  , COMPARE_TOL);

  BOOST_CHECK_CLOSE(q.real(),  1., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_i(),2., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_j(),3., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_k(),4., COMPARE_TOL);
}